

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O0

Int __thiscall
ipx::LpSolver::CrossoverFromStartingPoint
          (LpSolver *this,double *x_start,double *slack_start,double *y_start,double *z_start)

{
  ipxint iVar1;
  Int IVar2;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  Control *in_RDI;
  undefined1 *this_00;
  bool bVar6;
  double dVar7;
  LpSolver *unaff_retaddr;
  LpSolver *in_stack_00000010;
  Int nz;
  Int j_1;
  Vector colweight;
  Timer timer;
  Int j;
  SparseMatrix *AI;
  Vector *ub;
  Vector *lb;
  Int n;
  Int m;
  pointer __p;
  double in_stack_fffffffffffffe30;
  SparseMatrix *this_01;
  size_t in_stack_fffffffffffffe38;
  valarray<double> *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffea8;
  Control *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  Basis *in_stack_fffffffffffffec0;
  Vector *in_stack_fffffffffffffed8;
  double *in_stack_fffffffffffffee0;
  double *in_stack_fffffffffffffee8;
  double *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Model *in_stack_ffffffffffffff00;
  Vector *in_stack_ffffffffffffff10;
  Vector *in_stack_ffffffffffffff18;
  Control *info;
  allocator *colscale;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int local_a4;
  valarray<double> local_a0;
  int local_88;
  allocator local_71;
  string local_70 [32];
  SparseMatrix *local_50;
  Vector *local_48;
  Vector *local_40;
  Int local_38;
  Int local_34;
  Int local_4;
  
  this_00 = &in_RDI[1].field_0x1d0;
  info = in_RDI;
  local_34 = Model::rows((Model *)this_00);
  local_38 = Model::cols((Model *)this_00);
  local_40 = Model::lb((Model *)this_00);
  local_48 = Model::ub((Model *)this_00);
  local_50 = Model::AI((Model *)this_00);
  ClearSolution(unaff_retaddr);
  colscale = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Crossover from starting point\n",colscale);
  Control::hLog(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::valarray<double>::resize
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::valarray<double>::resize
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::valarray<double>::resize
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::valarray<double>::resize
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  __p = (pointer)&in_RDI[1].dummy_.super_ostream.field_0x40;
  this_01 = (SparseMatrix *)&in_RDI[1].dummy_.super_ostream.field_0x50;
  Model::PresolveStartingPoint
            (in_stack_ffffffffffffff00,
             (double *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  for (local_88 = 0; local_88 < local_38 + local_34; local_88 = local_88 + 1) {
    pdVar5 = std::valarray<double>::operator[]
                       ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x30,
                        (long)local_88);
    dVar7 = *pdVar5;
    pdVar5 = std::valarray<double>::operator[](local_40,(long)local_88);
    if (dVar7 < *pdVar5) {
      return 0x69;
    }
    pdVar5 = std::valarray<double>::operator[]
                       ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x30,
                        (long)local_88);
    dVar7 = *pdVar5;
    pdVar5 = std::valarray<double>::operator[](local_48,(long)local_88);
    if (*pdVar5 <= dVar7 && dVar7 != *pdVar5) {
      return 0x69;
    }
    pdVar5 = std::valarray<double>::operator[]
                       ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x30,
                        (long)local_88);
    dVar7 = *pdVar5;
    pdVar5 = std::valarray<double>::operator[](local_40,(long)local_88);
    if (((dVar7 != *pdVar5) || (NAN(dVar7) || NAN(*pdVar5))) &&
       (pdVar5 = std::valarray<double>::operator[]
                           ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x50,
                            (long)local_88), 0.0 < *pdVar5)) {
      return 0x69;
    }
    pdVar5 = std::valarray<double>::operator[]
                       ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x30,
                        (long)local_88);
    dVar7 = *pdVar5;
    pdVar5 = std::valarray<double>::operator[](local_48,(long)local_88);
    if (((dVar7 != *pdVar5) || (NAN(dVar7) || NAN(*pdVar5))) &&
       (pdVar5 = std::valarray<double>::operator[]
                           ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x50,
                            (long)local_88), *pdVar5 <= 0.0 && *pdVar5 != 0.0)) {
      return 0x69;
    }
  }
  operator_new(0xb0);
  Basis::Basis(in_stack_fffffffffffffec0,
               (Control *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
               (Model *)in_stack_fffffffffffffeb0);
  std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::reset
            ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)this_01,__p);
  iVar1 = Control::crash_basis(in_RDI);
  if (iVar1 != 0) {
    Timer::Timer((Timer *)this_01);
    std::valarray<double>::valarray((valarray<double> *)this_01,(size_t)__p);
    for (local_a4 = 0; local_a4 < local_38 + local_34; local_a4 = local_a4 + 1) {
      IVar2 = SparseMatrix::entries(this_01,(Int)((ulong)__p >> 0x20));
      pdVar5 = std::valarray<double>::operator[](local_40,(long)local_a4);
      dVar7 = *pdVar5;
      pdVar5 = std::valarray<double>::operator[](local_48,(long)local_a4);
      if ((dVar7 != *pdVar5) || (NAN(dVar7) || NAN(*pdVar5))) {
        pdVar5 = std::valarray<double>::operator[](local_40,(long)local_a4);
        uVar3 = std::isinf(*pdVar5);
        if ((uVar3 & 1) != 0) {
          pdVar5 = std::valarray<double>::operator[](local_48,(long)local_a4);
          uVar3 = std::isinf(*pdVar5);
          if ((uVar3 & 1) != 0) {
            pdVar5 = std::valarray<double>::operator[](&local_a0,(long)local_a4);
            *pdVar5 = INFINITY;
            goto LAB_008397ba;
          }
        }
        pdVar5 = std::valarray<double>::operator[]
                           ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x50,
                            (long)local_a4);
        if ((*pdVar5 != 0.0) || (NAN(*pdVar5))) {
          pdVar5 = std::valarray<double>::operator[](&local_a0,(long)local_a4);
          *pdVar5 = 0.0;
        }
        else {
          pdVar5 = std::valarray<double>::operator[]
                             ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x30,
                              (long)local_a4);
          dVar7 = *pdVar5;
          pdVar5 = std::valarray<double>::operator[](local_40,(long)local_a4);
          if ((dVar7 != *pdVar5) || (NAN(dVar7) || NAN(*pdVar5))) {
            pdVar5 = std::valarray<double>::operator[]
                               ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x30,
                                (long)local_a4);
            dVar7 = *pdVar5;
            pdVar5 = std::valarray<double>::operator[](local_48,(long)local_a4);
            if ((dVar7 != *pdVar5) || (NAN(dVar7) || NAN(*pdVar5))) {
              iVar4 = local_34 * 2;
              pdVar5 = std::valarray<double>::operator[](&local_a0,(long)local_a4);
              *pdVar5 = (double)((iVar4 - IVar2) + 1);
              goto LAB_008397ba;
            }
          }
          iVar4 = local_34 - IVar2;
          pdVar5 = std::valarray<double>::operator[](&local_a0,(long)local_a4);
          *pdVar5 = (double)(iVar4 + 1);
        }
      }
      else {
        pdVar5 = std::valarray<double>::operator[](&local_a0,(long)local_a4);
        *pdVar5 = 0.0;
      }
LAB_008397ba:
    }
    std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator->
              ((unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *)0x8397e6);
    std::valarray<double>::operator[](&local_a0,0);
    Basis::ConstructBasisFromWeights
              ((Basis *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               (double *)colscale,(Info *)info);
    dVar7 = Timer::Elapsed((Timer *)this_01);
    *(double *)&in_RDI[1].logfile_ = dVar7 + *(double *)&in_RDI[1].logfile_;
    bVar6 = *(int *)((long)&in_RDI[1].parameters_.super_ipx_parameters.logfile + 4) != 0;
    if (bVar6) {
      ClearSolution(unaff_retaddr);
      local_4 = 0;
    }
    uVar3 = (uint)bVar6;
    std::valarray<double>::~valarray((valarray<double> *)this_01);
    if (uVar3 != 0) {
      return local_4;
    }
  }
  RunCrossover(in_stack_00000010);
  return 0;
}

Assistant:

Int LpSolver::CrossoverFromStartingPoint(const double* x_start,
                                         const double* slack_start,
                                         const double* y_start,
                                         const double* z_start) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    const SparseMatrix& AI = model_.AI();

    ClearSolution();
    control_.hLog("Crossover from starting point\n");

    x_crossover_.resize(n+m);
    y_crossover_.resize(m);
    z_crossover_.resize(n+m);
    crossover_weights_.resize(0);
    model_.PresolveStartingPoint(x_start, slack_start, y_start, z_start,
                                 x_crossover_, y_crossover_, z_crossover_);

    // Check that starting point is complementary and satisfies bound and sign
    // conditions.
    for (Int j = 0; j < n+m; j++) {
        if (x_crossover_[j] < lb[j] || x_crossover_[j] > ub[j])
            return IPX_ERROR_invalid_vector;
        if (x_crossover_[j] != lb[j] && z_crossover_[j] > 0.0)
            return IPX_ERROR_invalid_vector;
        if (x_crossover_[j] != ub[j] && z_crossover_[j] < 0.0)
            return IPX_ERROR_invalid_vector;
    }

    // Construct starting basis.
    basis_.reset(new Basis(control_, model_));
    if (control_.crash_basis()) {
        // Take columns in the following order of priority:
        // - free columns
        // - columns between their bounds, in increasing number of nonzeros
        // - columns with zero dual, in increasing number of nonzeros
        // - Fixed columns and those with nonzero dual
        Timer timer;
        Vector colweight(n+m);
        for (Int j = 0; j < n+m; j++) {
            Int nz = AI.entries(j);
            if (lb[j] == ub[j])
                colweight[j] = 0.0;
            else if (std::isinf(lb[j]) && std::isinf(ub[j]))
                colweight[j] = INFINITY;
            else if (z_crossover_[j] != 0.0)
                colweight[j] = 0.0;
            else if (x_crossover_[j] != lb[j] && x_crossover_[j] != ub[j])
                colweight[j] = m + (m-nz+1);
            else
                colweight[j] = m-nz+1;
        }
        basis_->ConstructBasisFromWeights(&colweight[0], &info_);
        info_.time_starting_basis += timer.Elapsed();
        if (info_.errflag) {
            ClearSolution();
            return 0;
        }
    }

    RunCrossover();
    return 0;
}